

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9DeepSyn(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  Gia_Man_t *pNew;
  char *pcVar3;
  uint local_44;
  uint local_40;
  int fVerbose;
  int Seed;
  int nAnds;
  int TimeOut;
  int c;
  Gia_Man_t *pTemp;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Seed = 0;
  fVerbose = 0;
  local_40 = 0;
  local_44 = 0;
  Extra_UtilGetoptReset();
LAB_002c3c16:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"TASvh");
    if (iVar1 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9DeepSyn(): There is no AIG.\n");
        return 0;
      }
      pNew = Gia_ManDeepSyn(pAbc->pGia,Seed,fVerbose,local_40,local_44);
      Abc_FrameUpdateGia(pAbc,pNew);
      return 0;
    }
    if (iVar1 == 0x41) {
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-A\" should be followed by an integer.\n");
        goto LAB_002c3e1e;
      }
      fVerbose = atoi(argv[globalUtilOptind]);
      uVar2 = fVerbose;
    }
    else if (iVar1 == 0x53) {
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-S\" should be followed by an integer.\n");
        goto LAB_002c3e1e;
      }
      local_40 = atoi(argv[globalUtilOptind]);
      uVar2 = local_40;
    }
    else {
      if (iVar1 != 0x54) {
        if ((iVar1 == 0x68) || (iVar1 != 0x76)) goto LAB_002c3e1e;
        local_44 = local_44 ^ 1;
        goto LAB_002c3c16;
      }
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-T\" should be followed by an integer.\n");
        goto LAB_002c3e1e;
      }
      Seed = atoi(argv[globalUtilOptind]);
      uVar2 = Seed;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)uVar2 < 0) {
LAB_002c3e1e:
      Abc_Print(-2,"usage: &deepsyn [-TAS <num>] [-vh]\n");
      Abc_Print(-2,"\t           performs synthesis\n");
      Abc_Print(-2,"\t-T <num> : the timeout in seconds (0 = no timeout) [default = %d]\n",
                (ulong)(uint)Seed);
      Abc_Print(-2,"\t-A <num> : the number of nodes to stop (0 = no limit) [default = %d]\n",
                (ulong)(uint)fVerbose);
      Abc_Print(-2,"\t-S <num> : user-specified random seed (0 <= num <= 100) [default = %d]\n",
                (ulong)local_40);
      pcVar3 = "no";
      if (local_44 != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-v       : toggle printing optimization summary [default = %s]\n",pcVar3);
      Abc_Print(-2,"\t-h       : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9DeepSyn( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_ManDeepSyn( Gia_Man_t * pGia, int TimeOut, int nAnds, int Seed, int fVerbose );
    Gia_Man_t * pTemp; int c, TimeOut = 0, nAnds = 0, Seed = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "TASvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            TimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( TimeOut < 0 )
                goto usage;
            break;
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by an integer.\n" );
                goto usage;
            }
            nAnds = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nAnds < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            Seed = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Seed < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9DeepSyn(): There is no AIG.\n" );
        return 0;
    }
    pTemp = Gia_ManDeepSyn( pAbc->pGia, TimeOut, nAnds, Seed, fVerbose );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &deepsyn [-TAS <num>] [-vh]\n" );
    Abc_Print( -2, "\t           performs synthesis\n" );
    Abc_Print( -2, "\t-T <num> : the timeout in seconds (0 = no timeout) [default = %d]\n",    TimeOut );
    Abc_Print( -2, "\t-A <num> : the number of nodes to stop (0 = no limit) [default = %d]\n", nAnds   );
    Abc_Print( -2, "\t-S <num> : user-specified random seed (0 <= num <= 100) [default = %d]\n", Seed   );
    Abc_Print( -2, "\t-v       : toggle printing optimization summary [default = %s]\n",       fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}